

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O3

bool __thiscall
tcu::anon_unknown_0::comparePixelRGBA8
          (anon_unknown_0 *this,ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
          RGBA threshold,int x,int y)

{
  RGBA a;
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  RGBA b;
  deUint32 v;
  uint uVar6;
  uint uVar7;
  deUint32 u;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint uVar17;
  int iVar18;
  RGBA local_54;
  undefined8 local_50;
  uint local_44;
  ulong local_40;
  undefined8 local_38;
  
  local_50 = CONCAT44(in_register_0000008c,y);
  local_38 = CONCAT44(in_register_00000084,x);
  local_40 = (ulong)(uint)(x * 4);
  iVar18 = x + -1;
  if (iVar18 < 1) {
    iVar18 = 0;
  }
  iVar15 = *(int *)(this + 8) + -1;
  if (x + 1 < *(int *)(this + 8) + -1) {
    iVar15 = x + 1;
  }
  iVar16 = 0;
  if (0 < y + -1) {
    iVar16 = y + -1;
  }
  iVar2 = *(int *)(this + 0xc) + -1;
  if (y + 1 < *(int *)(this + 0xc) + -1) {
    iVar2 = y + 1;
  }
  a.m_value = *(deUint32 *)
               ((long)(result->m_size).m_data + local_40 + (uint)((int)reference * y) + -8);
  uVar17 = *(uint *)(local_40 + (ulong)(uint)(*(int *)(this + 0x18) * y) + *(long *)(this + 0x20));
  if (a.m_value != uVar17) {
    local_44 = a.m_value & 0xff;
    uVar6 = local_44 - (uVar17 & 0xff);
    uVar1 = -uVar6;
    if (0 < (int)uVar6) {
      uVar1 = uVar6;
    }
    uVar6 = a.m_value >> 8 & 0xff;
    iVar13 = uVar6 - (uVar17 >> 8 & 0xff);
    iVar14 = -iVar13;
    if (0 < iVar13) {
      iVar14 = iVar13;
    }
    uVar5 = a.m_value >> 0x10 & 0xff;
    iVar10 = uVar5 - (uVar17 >> 0x10 & 0xff);
    iVar13 = -iVar10;
    if (0 < iVar10) {
      iVar13 = iVar10;
    }
    uVar11 = a.m_value >> 0x18;
    iVar12 = uVar11 - (uVar17 >> 0x18);
    iVar10 = -iVar12;
    if (0 < iVar12) {
      iVar10 = iVar12;
    }
    local_54.m_value = iVar13 << 0x10 | iVar14 << 8 | iVar10 << 0x18 | uVar1;
    bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
    uVar17 = local_44;
    if (!bVar4) {
      uVar8 = (ulong)(uint)(iVar18 << 2);
      uVar1 = *(uint *)(uVar8 + (ulong)(uint)(*(int *)(this + 0x18) * (int)local_50) +
                                *(long *)(this + 0x20));
      if (a.m_value != uVar1) {
        uVar7 = local_44 - (uVar1 & 0xff);
        uVar3 = -uVar7;
        if (0 < (int)uVar7) {
          uVar3 = uVar7;
        }
        iVar14 = uVar6 - (uVar1 >> 8 & 0xff);
        iVar18 = -iVar14;
        if (0 < iVar14) {
          iVar18 = iVar14;
        }
        iVar13 = uVar5 - (uVar1 >> 0x10 & 0xff);
        iVar14 = -iVar13;
        if (0 < iVar13) {
          iVar14 = iVar13;
        }
        iVar10 = uVar11 - (uVar1 >> 0x18);
        iVar13 = -iVar10;
        if (0 < iVar10) {
          iVar13 = iVar10;
        }
        local_54.m_value = iVar14 << 0x10 | iVar18 << 8 | iVar13 << 0x18 | uVar3;
        bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
        if (!bVar4) {
          uVar9 = (ulong)(uint)(iVar15 << 2);
          uVar1 = *(uint *)(uVar9 + (ulong)(uint)(*(int *)(this + 0x18) * (int)local_50) +
                                    *(long *)(this + 0x20));
          if (a.m_value != uVar1) {
            uVar7 = uVar17 - (uVar1 & 0xff);
            uVar3 = -uVar7;
            if (0 < (int)uVar7) {
              uVar3 = uVar7;
            }
            iVar15 = uVar6 - (uVar1 >> 8 & 0xff);
            iVar18 = -iVar15;
            if (0 < iVar15) {
              iVar18 = iVar15;
            }
            iVar14 = uVar5 - (uVar1 >> 0x10 & 0xff);
            iVar15 = -iVar14;
            if (0 < iVar14) {
              iVar15 = iVar14;
            }
            iVar13 = uVar11 - (uVar1 >> 0x18);
            iVar14 = -iVar13;
            if (0 < iVar13) {
              iVar14 = iVar13;
            }
            local_54.m_value = iVar15 << 0x10 | iVar18 << 8 | iVar14 << 0x18 | uVar3;
            bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
            if ((!bVar4) &&
               (uVar1 = *(uint *)(uVar8 + (ulong)(uint)(*(int *)(this + 0x18) * iVar16) +
                                          *(long *)(this + 0x20)), a.m_value != uVar1)) {
              uVar7 = uVar17 - (uVar1 & 0xff);
              uVar3 = -uVar7;
              if (0 < (int)uVar7) {
                uVar3 = uVar7;
              }
              iVar15 = uVar6 - (uVar1 >> 8 & 0xff);
              iVar18 = -iVar15;
              if (0 < iVar15) {
                iVar18 = iVar15;
              }
              iVar14 = uVar5 - (uVar1 >> 0x10 & 0xff);
              iVar15 = -iVar14;
              if (0 < iVar14) {
                iVar15 = iVar14;
              }
              iVar13 = uVar11 - (uVar1 >> 0x18);
              iVar14 = -iVar13;
              if (0 < iVar13) {
                iVar14 = iVar13;
              }
              local_54.m_value = iVar15 << 0x10 | iVar18 << 8 | iVar14 << 0x18 | uVar3;
              bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
              if ((!bVar4) &&
                 (uVar1 = *(uint *)(local_40 +
                                   (ulong)(uint)(*(int *)(this + 0x18) * iVar16) +
                                   *(long *)(this + 0x20)), a.m_value != uVar1)) {
                uVar7 = uVar17 - (uVar1 & 0xff);
                uVar3 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar3 = uVar7;
                }
                iVar15 = uVar6 - (uVar1 >> 8 & 0xff);
                iVar18 = -iVar15;
                if (0 < iVar15) {
                  iVar18 = iVar15;
                }
                iVar14 = uVar5 - (uVar1 >> 0x10 & 0xff);
                iVar15 = -iVar14;
                if (0 < iVar14) {
                  iVar15 = iVar14;
                }
                iVar13 = uVar11 - (uVar1 >> 0x18);
                iVar14 = -iVar13;
                if (0 < iVar13) {
                  iVar14 = iVar13;
                }
                local_54.m_value = iVar15 << 0x10 | iVar18 << 8 | iVar14 << 0x18 | uVar3;
                bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
                if ((!bVar4) &&
                   (uVar1 = *(uint *)(uVar9 + (ulong)(uint)(iVar16 * *(int *)(this + 0x18)) +
                                              *(long *)(this + 0x20)), a.m_value != uVar1)) {
                  uVar17 = uVar17 - (uVar1 & 0xff);
                  uVar3 = -uVar17;
                  if (0 < (int)uVar17) {
                    uVar3 = uVar17;
                  }
                  iVar15 = uVar6 - (uVar1 >> 8 & 0xff);
                  iVar18 = -iVar15;
                  if (0 < iVar15) {
                    iVar18 = iVar15;
                  }
                  iVar16 = uVar5 - (uVar1 >> 0x10 & 0xff);
                  iVar15 = -iVar16;
                  if (0 < iVar16) {
                    iVar15 = iVar16;
                  }
                  iVar14 = uVar11 - (uVar1 >> 0x18);
                  iVar16 = -iVar14;
                  if (0 < iVar14) {
                    iVar16 = iVar14;
                  }
                  local_54.m_value = iVar15 << 0x10 | iVar18 << 8 | iVar16 << 0x18 | uVar3;
                  bVar4 = RGBA::isBelowThreshold(&local_54,threshold);
                  if ((((!bVar4) &&
                       (bVar4 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                          (uVar8 + (ulong)(uint)(*(int *)(this + 
                                                  0x18) * iVar2) + *(long *)(this + 0x20)),threshold
                                                ), !bVar4)) &&
                      (bVar4 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                         (local_40 +
                                                         (ulong)(uint)(*(int *)(this + 0x18) * iVar2
                                                                      ) + *(long *)(this + 0x20)),
                                                threshold), !bVar4)) &&
                     (bVar4 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                        (uVar9 + (ulong)(uint)(iVar2 * *(int *)(this
                                                                                               + 
                                                  0x18)) + *(long *)(this + 0x20)),threshold),
                     !bVar4)) {
                    iVar18 = (int)local_38;
                    iVar15 = (int)local_50;
                    uVar8 = 0xffffffffffffffff;
                    do {
                      u = comparePixelRGBA8::s_offsets[uVar8 + 1][0] + iVar18 * 0x100 + -0x100;
                      if (((-1 < (int)u) && ((int)u < *(int *)(this + 8) * 0x100 + -0x100)) &&
                         ((v = comparePixelRGBA8::s_offsets[uVar8 + 1][1] + iVar15 * 0x100 + -0x100,
                          -1 < (int)v && ((int)v < *(int *)(this + 0xc) * 0x100 + -0x100)))) {
                        b = bilinearSampleRGBA8((anon_unknown_0 *)(ulong)*(uint *)(this + 0x18),
                                                *(ConstPixelBufferAccess **)(this + 0x20),u,v);
                        bVar4 = compareThreshold(a,b,threshold);
                        if (bVar4) {
                          return true;
                        }
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar8 != 0x1b);
                    return uVar8 < 0x1b;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool comparePixelRGBA8 (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, int x, int y)
{
	const RGBA resPix = readRGBA8(result, (deUint32)x, (deUint32)y);

	// Step 1: Compare result pixel to 3x3 neighborhood pixels in reference.
	{
		const deUint32	x0		= (deUint32)de::max(x-1, 0);
		const deUint32	x1		= (deUint32)x;
		const deUint32	x2		= (deUint32)de::min(x+1, reference.getWidth()-1);
		const deUint32	y0		= (deUint32)de::max(y-1, 0);
		const deUint32	y1		= (deUint32)y;
		const deUint32	y2		= (deUint32)de::min(y+1, reference.getHeight()-1);

		if (compareThreshold(resPix, readRGBA8(reference, x1, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y2), threshold))
			return true;
	}

	// Step 2: Compare using bilinear sampling.
	{
		// \todo [pyry] Optimize sample positions!
		static const deUint32 s_offsets[][2] =
		{
			{ 226, 186 },
			{ 335, 235 },
			{ 279, 334 },
			{ 178, 272 },
			{ 112, 202 },
			{ 306, 117 },
			{ 396, 299 },
			{ 206, 382 },
			{ 146,  96 },
			{ 423, 155 },
			{ 361, 412 },
			{  84, 339 },
			{  48, 130 },
			{ 367,  43 },
			{ 455, 367 },
			{ 105, 439 },
			{  83,  46 },
			{ 217,  24 },
			{ 461,  71 },
			{ 450, 459 },
			{ 239, 469 },
			{  67, 267 },
			{ 459, 255 },
			{  13, 416 },
			{  10, 192 },
			{ 141, 502 },
			{ 503, 304 },
			{ 380, 506 }
		};

		for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(s_offsets); sampleNdx++)
		{
			const int u = (x<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][0] - (1<<NUM_SUBPIXEL_BITS);
			const int v = (y<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][1] - (1<<NUM_SUBPIXEL_BITS);

			if (!de::inBounds(u, 0, (reference.getWidth()-1)<<NUM_SUBPIXEL_BITS) ||
				!de::inBounds(v, 0, (reference.getHeight()-1)<<NUM_SUBPIXEL_BITS))
				continue;

			if (compareThreshold(resPix, bilinearSampleRGBA8(reference, (deUint32)u, (deUint32)v), threshold))
				return true;
		}
	}

	return false;
}